

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intUtil.c
# Opt level: O2

int Inter_ManCheckInitialState(Aig_Man_t *p)

{
  int iVar1;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Abc_Cex_t *pAVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  p_00 = Cnf_Derive(p,p->nRegs);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,1);
  if (s == (sat_solver *)0x0) {
    Cnf_DataFree(p_00);
    uVar5 = 0;
  }
  else {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar1 == 1) {
      pAVar2 = Abc_CexAlloc(p->nRegs,p->nTruePis,1);
      p->pSeqModel = pAVar2;
      for (lVar4 = 0; lVar4 < p->nTruePis; lVar4 = lVar4 + 1) {
        if (p->vCis->nSize <= lVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar3 = p_00->pVarNums[*(int *)((long)p->vCis->pArray[lVar4] + 0x24)];
        if (((long)iVar3 < 0) || (s->size <= iVar3)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (s->model[iVar3] == 1) {
          iVar3 = p->nRegs + (int)lVar4;
          (&pAVar2[1].iPo)[iVar3 >> 5] = (&pAVar2[1].iPo)[iVar3 >> 5] | 1 << ((byte)iVar3 & 0x1f);
        }
      }
    }
    uVar5 = (uint)(iVar1 == 1);
    Cnf_DataFree(p_00);
    sat_solver_delete(s);
  }
  return uVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////


/**Function*************************************************************

  Synopsis    [Returns 1 if the property fails in the initial state.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Inter_ManCheckInitialState( Aig_Man_t * p )
{
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    sat_solver * pSat;
    int i, status;
    //abctime clk = Abc_Clock();
    pCnf = Cnf_Derive( p, Saig_ManRegNum(p) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 1 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return 0;
    }
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    //ABC_PRT( "Time", Abc_Clock() - clk );
    if ( status == l_True )
    {
        p->pSeqModel = Abc_CexAlloc( Aig_ManRegNum(p), Saig_ManPiNum(p), 1 );
        Saig_ManForEachPi( p, pObj, i )
            if ( sat_solver_var_value( pSat, pCnf->pVarNums[Aig_ObjId(pObj)] ) )
                Abc_InfoSetBit( p->pSeqModel->pData, Aig_ManRegNum(p) + i );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    return status == l_True;
}